

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

void __thiscall
bssl::InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::Shrink
          (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *this,
          size_t new_size)

{
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *puVar1;
  size_t new_size_local;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *this_local;
  
  if (this->size_ < new_size) {
    abort();
  }
  puVar1 = data(this);
  std::destroy_n<std::unique_ptr<bssl::DTLSWriteEpoch,bssl::internal::Deleter>*,unsigned_long>
            (puVar1 + new_size,this->size_ - new_size);
  this->size_ = (PackedSize<2UL>)new_size;
  return;
}

Assistant:

void Shrink(size_t new_size) {
    BSSL_CHECK(new_size <= size_);
    std::destroy_n(data() + new_size, size_ - new_size);
    size_ = static_cast<PackedSize<N>>(new_size);
  }